

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O3

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> __thiscall
duckdb::ClientContext::Query
          (ClientContext *this,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement,bool allow_stream_result)

{
  pointer pcVar1;
  ErrorData *pEVar2;
  pointer pPVar3;
  undefined7 in_register_00000011;
  pointer *__ptr;
  __alloc_node_gen_t __alloc_node_gen;
  undefined1 local_e8 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  element_type *local_d8;
  string local_d0;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  char local_98 [16];
  _Alloc_hider local_88;
  char local_78 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_68;
  __node_base local_58;
  size_type local_50;
  _Prime_rehash_policy local_48;
  __node_base_ptr local_38;
  
  local_d8 = *(element_type **)CONCAT71(in_register_00000011,allow_stream_result);
  *(long *)CONCAT71(in_register_00000011,allow_stream_result) = 0;
  PendingQuery((ClientContext *)local_e8,statement,SUB81(&local_d8,0));
  if (local_d8 != (element_type *)0x0) {
    (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(((local_d8->super_enable_shared_from_this<duckdb::DatabaseInstance>).
                        __weak_this_.internal.
                        super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_enable_shared_from_this<duckdb::DatabaseInstance>).
                      __weak_this_ + 8))->_M_pi)();
  }
  pPVar3 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                         *)local_e8);
  if ((pPVar3->super_BaseQueryResult).success == false) {
    pPVar3 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
             ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                           *)local_e8);
    local_b0[0] = (pPVar3->super_BaseQueryResult).error.initialized;
    local_b0[1] = (pPVar3->super_BaseQueryResult).error.type;
    pcVar1 = (pPVar3->super_BaseQueryResult).error.raw_message._M_dataplus._M_p;
    local_a8._M_p = local_98;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar1,
               pcVar1 + (pPVar3->super_BaseQueryResult).error.raw_message._M_string_length);
    pcVar1 = (pPVar3->super_BaseQueryResult).error.final_message._M_dataplus._M_p;
    local_88._M_p = local_78;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar1,
               pcVar1 + (pPVar3->super_BaseQueryResult).error.final_message._M_string_length);
    local_68._vptr__Sp_counted_base = (_func_int **)0x0;
    local_68._8_8_ = (pPVar3->super_BaseQueryResult).error.extra_info._M_h._M_bucket_count;
    local_58._M_nxt = (_Hash_node_base *)0x0;
    local_50 = (pPVar3->super_BaseQueryResult).error.extra_info._M_h._M_element_count;
    pEVar2 = &(pPVar3->super_BaseQueryResult).error;
    local_48._M_max_load_factor = (pEVar2->extra_info)._M_h._M_rehash_policy._M_max_load_factor;
    local_48._4_4_ = *(undefined4 *)&(pEVar2->extra_info)._M_h._M_rehash_policy.field_0x4;
    local_48._M_next_resize =
         (pPVar3->super_BaseQueryResult).error.extra_info._M_h._M_rehash_policy._M_next_resize;
    local_38 = (__node_base_ptr)0x0;
    local_d0._M_dataplus._M_p = (pointer)&local_68;
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_68,&(pPVar3->super_BaseQueryResult).error.extra_info._M_h,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
                *)&local_d0);
    local_d0._M_string_length = 0;
    local_d0.field_2._M_local_buf[0] = '\0';
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    ProcessError((ClientContext *)statement,(ErrorData *)local_b0,&local_d0);
    make_uniq<duckdb::MaterializedQueryResult,duckdb::ErrorData>
              ((duckdb *)&local_e0,(ErrorData *)local_b0);
    (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_e0._M_pi;
    local_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_68);
    if (local_88._M_p != local_78) {
      operator_delete(local_88._M_p);
    }
    if (local_a8._M_p != local_98) {
      operator_delete(local_a8._M_p);
    }
  }
  else {
    unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>::
    operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                *)local_e8);
    PendingQueryResult::Execute((PendingQueryResult *)this);
  }
  if (local_e8 != (undefined1  [8])0x0) {
    (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(((((weak_ptr<duckdb::ClientContext,_true> *)
                         &((BaseQueryResult *)local_e8)->_vptr_BaseQueryResult)->internal).
                        super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_ + 8))->
              _M_pi)();
  }
  return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
         (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)this;
}

Assistant:

unique_ptr<QueryResult> ClientContext::Query(unique_ptr<SQLStatement> statement, bool allow_stream_result) {
	auto pending_query = PendingQuery(std::move(statement), allow_stream_result);
	if (pending_query->HasError()) {
		return ErrorResult<MaterializedQueryResult>(pending_query->GetErrorObject());
	}
	return pending_query->Execute();
}